

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

void Js::JavascriptBigInt::Decrement(JavascriptBigInt *pbi)

{
  unsigned_long *puVar1;
  
  if (pbi->m_isNegative == true) {
    AbsoluteIncrement(pbi);
    return;
  }
  if ((pbi->m_length == 1) && (puVar1 = (pbi->m_digits).ptr, *puVar1 == 0)) {
    *puVar1 = 1;
    pbi->m_isNegative = true;
    return;
  }
  AbsoluteDecrement(pbi);
  return;
}

Assistant:

void JavascriptBigInt::Decrement(JavascriptBigInt * pbi)
    {
        if (pbi->m_isNegative)
        {
            return JavascriptBigInt::AbsoluteIncrement(pbi);
        }
        if (JavascriptBigInt::IsZero(pbi)) // return -1n for 0n
        {
            JavascriptBigInt* result = pbi;
            result->m_digits[0] = 1;
            result->m_isNegative = true;
            return;
        }
        return JavascriptBigInt::AbsoluteDecrement(pbi);
    }